

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OnceReduction.cpp
# Opt level: O2

void __thiscall wasm::OnceReduction::run(OnceReduction *this,Module *module)

{
  __node_base_ptr *__ht;
  pointer puVar1;
  Global *__k;
  pointer puVar2;
  pointer puVar3;
  Export *pEVar4;
  size_t sVar5;
  uint uVar6;
  Nop *output_1;
  mapped_type *pmVar7;
  mapped_type *pmVar8;
  _Insert_base<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  *this_00;
  Block *pBVar9;
  Expression **ppEVar10;
  size_type sVar11;
  size_type *psVar12;
  unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *global;
  pointer puVar13;
  pointer puVar14;
  pointer puVar15;
  Expression *pEVar16;
  variant<wasm::Name,_wasm::HeapType> *__k_00;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *func_3;
  size_type *psVar17;
  ExpressionList *this_01;
  bool bVar18;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *func_2;
  uint uVar19;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *func_1;
  __int_type _Var20;
  undefined1 auStack_3b8 [8];
  mapped_type global_1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_398;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  _Stack_388;
  bool local_368;
  Expression **local_360;
  size_t sStack_358;
  pointer local_2b0;
  pointer pTStack_2a8;
  pointer local_2a0;
  Function *pFStack_298;
  Module *local_290;
  BasicBlock *pBStack_288;
  BasicBlock *local_280;
  __node_base _Stack_278;
  pointer puStack_270;
  pointer local_268;
  pointer local_260;
  undefined1 auStack_258 [40];
  _Base_ptr local_230;
  _Base_ptr local_228;
  _Base_ptr local_220;
  undefined1 local_218 [192];
  _Rb_tree_node_base local_158;
  size_t local_138;
  undefined1 *local_130;
  undefined1 local_120 [8];
  OptInfo optInfo;
  vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
  *__range2;
  
  local_120 = (undefined1  [8])&optInfo.onceGlobals._M_h._M_rehash_policy._M_next_resize;
  optInfo.onceGlobals._M_h._M_buckets = (__buckets_ptr)0x1;
  optInfo.onceGlobals._M_h._M_bucket_count = 0;
  optInfo.onceGlobals._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  optInfo.onceGlobals._M_h._M_element_count._0_4_ = 0x3f800000;
  optInfo.onceGlobals._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  optInfo.onceGlobals._M_h._M_rehash_policy._4_4_ = 0;
  optInfo.onceGlobals._M_h._M_rehash_policy._M_next_resize = 0;
  optInfo.onceGlobals._M_h._M_single_bucket =
       (__node_base_ptr)&optInfo.onceFuncs._M_h._M_rehash_policy._M_next_resize;
  optInfo.onceFuncs._M_h._M_buckets = (__buckets_ptr)0x1;
  psVar17 = &optInfo.onceFuncs._M_h._M_bucket_count;
  optInfo.onceFuncs._M_h._M_bucket_count = 0;
  optInfo.onceFuncs._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  optInfo.onceFuncs._M_h._M_element_count._0_4_ = 0x3f800000;
  optInfo.onceFuncs._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  optInfo.onceFuncs._M_h._M_rehash_policy._4_4_ = 0;
  optInfo.onceFuncs._M_h._M_rehash_policy._M_next_resize = 0;
  optInfo.onceFuncs._M_h._M_single_bucket =
       (__node_base_ptr)&optInfo.onceGlobalsSetInFuncs._M_h._M_rehash_policy._M_next_resize;
  optInfo.onceGlobalsSetInFuncs._M_h._M_buckets = (__buckets_ptr)0x1;
  optInfo.onceGlobalsSetInFuncs._M_h._M_bucket_count = 0;
  optInfo.onceGlobalsSetInFuncs._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  optInfo.onceGlobalsSetInFuncs._M_h._M_element_count._0_4_ = 0x3f800000;
  optInfo.onceGlobalsSetInFuncs._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  optInfo.onceGlobalsSetInFuncs._M_h._M_rehash_policy._4_4_ = 0;
  optInfo.onceGlobalsSetInFuncs._M_h._M_rehash_policy._M_next_resize = 0;
  __ht = &optInfo.onceGlobalsSetInFuncs._M_h._M_single_bucket;
  optInfo.onceGlobalsSetInFuncs._M_h._M_single_bucket =
       (__node_base_ptr)&optInfo.newOnceGlobalsSetInFuncs._M_h._M_rehash_policy._M_next_resize;
  optInfo.newOnceGlobalsSetInFuncs._M_h._M_buckets = (__buckets_ptr)0x1;
  optInfo.newOnceGlobalsSetInFuncs._M_h._M_bucket_count = 0;
  optInfo.newOnceGlobalsSetInFuncs._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  optInfo.newOnceGlobalsSetInFuncs._M_h._M_element_count._0_4_ = 0x3f800000;
  optInfo.newOnceGlobalsSetInFuncs._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  optInfo.newOnceGlobalsSetInFuncs._M_h._M_rehash_policy._4_4_ = 0;
  optInfo.newOnceGlobalsSetInFuncs._M_h._M_rehash_policy._M_next_resize = 0;
  puVar1 = (module->globals).
           super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  optInfo.newOnceGlobalsSetInFuncs._M_h._M_single_bucket = (__node_base_ptr)this;
  for (puVar13 = (module->globals).
                 super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar13 != puVar1; puVar13 = puVar13 + 1
      ) {
    __k = (puVar13->_M_t).super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>.
          _M_t.super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
          super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
    if (((__k->type).id & 0xfffffffffffffffe) == 2) {
      _Var20 = *(char **)((long)&(__k->super_Importable).module + 8) == (char *)0x0;
    }
    else {
      _Var20 = false;
    }
    pmVar7 = std::__detail::
             _Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::atomic<bool>_>,_std::allocator<std::pair<const_wasm::Name,_std::atomic<bool>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::atomic<bool>_>,_std::allocator<std::pair<const_wasm::Name,_std::atomic<bool>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)local_120,(key_type *)__k);
    LOCK();
    (pmVar7->_M_base)._M_i = _Var20;
    UNLOCK();
  }
  puVar2 = (module->functions).
           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar14 = (module->functions).
                 super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar14 != puVar2; puVar14 = puVar14 + 1
      ) {
    pmVar8 = std::__detail::
             _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&optInfo.onceGlobals._M_h._M_single_bucket,
                          (key_type *)
                          (puVar14->_M_t).
                          super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                          .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl);
    (pmVar8->super_IString).str._M_len = 0;
    (pmVar8->super_IString).str._M_str = (char *)0x0;
  }
  puVar3 = (module->exports).
           super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar15 = (module->exports).
                 super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar15 != puVar3; puVar15 = puVar15 + 1
      ) {
    pEVar4 = (puVar15->_M_t).super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>
             ._M_t.super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
             super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
    if (pEVar4->kind == Global) {
      if (*(__index_type *)
           ((long)&(pEVar4->value).super__Variant_base<wasm::Name,_wasm::HeapType> + 0x10) == '\0')
      {
        __k_00 = &pEVar4->value;
      }
      else {
        __k_00 = (variant<wasm::Name,_wasm::HeapType> *)0x0;
      }
      pmVar7 = std::__detail::
               _Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::atomic<bool>_>,_std::allocator<std::pair<const_wasm::Name,_std::atomic<bool>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::atomic<bool>_>,_std::allocator<std::pair<const_wasm::Name,_std::atomic<bool>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)local_120,(key_type *)__k_00);
      LOCK();
      (pmVar7->_M_base)._M_i = false;
      UNLOCK();
    }
  }
  global_1.super_IString.str._M_str = (char *)&local_398;
  global_1.super_IString.str._M_len = 0;
  local_398._M_allocated_capacity._0_4_ = local_398._M_allocated_capacity._0_4_ & 0xffffff00;
  local_368 = false;
  local_360 = (Expression **)0x0;
  sStack_358 = 0;
  local_290 = (Module *)0x0;
  local_2b0 = (pointer)0x0;
  pTStack_2a8 = (pointer)0x0;
  local_2a0 = (pointer)0x0;
  pFStack_298 = (Function *)0x0;
  auStack_3b8 = (undefined1  [8])&PTR__Scanner_01123108;
  pBStack_288 = (BasicBlock *)auStack_258;
  local_280 = (BasicBlock *)0x1;
  _Stack_278._M_nxt = (_Hash_node_base *)0x0;
  puStack_270 = (pointer)0x0;
  local_268 = (pointer)CONCAT44(local_268._4_4_,1.0);
  local_260 = (pointer)0x0;
  auStack_258._0_8_ = (__node_base_ptr)0x0;
  auStack_258._8_8_ = (OptInfo *)local_120;
  Pass::setPassRunner((Pass *)auStack_3b8,
                      (PassRunner *)optInfo.newOnceGlobalsSetInFuncs._M_h._M_single_bucket[1]._M_nxt
                     );
  (**(code **)((long)auStack_3b8 + 0x10))((Pass *)auStack_3b8);
  anon_unknown_22::Scanner::~Scanner((Scanner *)auStack_3b8);
  while (psVar17 = (size_type *)*psVar17, psVar17 != (size_type *)0x0) {
    if (psVar17[4] != 0) {
      pmVar7 = std::__detail::
               _Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::atomic<bool>_>,_std::allocator<std::pair<const_wasm::Name,_std::atomic<bool>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::atomic<bool>_>,_std::allocator<std::pair<const_wasm::Name,_std::atomic<bool>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)local_120,(key_type *)(psVar17 + 3));
      if (((pmVar7->_M_base)._M_i & 1U) == 0) {
        *(undefined8 *)(psVar17 + 3) = 0;
        psVar17[4] = 0;
      }
    }
  }
  puVar2 = (module->functions).
           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar18 = false;
  for (puVar14 = (module->functions).
                 super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar14 != puVar2; puVar14 = puVar14 + 1
      ) {
    this_00 = (_Insert_base<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
               *)std::__detail::
                 _Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)&optInfo.onceFuncs._M_h._M_single_bucket,
                              (key_type *)
                              (puVar14->_M_t).
                              super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                              .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl);
    pmVar8 = std::__detail::
             _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&optInfo.onceGlobals._M_h._M_single_bucket,
                          (key_type *)
                          (puVar14->_M_t).
                          super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                          .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl);
    auStack_3b8 = (undefined1  [8])(pmVar8->super_IString).str._M_len;
    global_1.super_IString.str._M_len = (size_t)(pmVar8->super_IString).str._M_str;
    if ((char *)global_1.super_IString.str._M_len != (char *)0x0) {
      bVar18 = true;
      std::__detail::
      _Insert_base<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::insert(this_00,(value_type *)auStack_3b8);
    }
  }
  if (bVar18) {
    uVar19 = 0;
    do {
      puVar2 = (module->functions).
               super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (puVar14 = (module->functions).
                     super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; puVar14 != puVar2;
          puVar14 = puVar14 + 1) {
        std::__detail::
        _Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
        ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      *)__ht,(key_type *)
                             (puVar14->_M_t).
                             super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                             .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl);
      }
      global_1.super_IString.str._M_len = 0;
      global_1.super_IString.str._M_str = (char *)&local_398;
      local_398._M_allocated_capacity._0_4_ = local_398._M_allocated_capacity._0_4_ & 0xffffff00;
      local_368 = false;
      local_360 = (Expression **)0x0;
      sStack_358 = 0;
      auStack_258._32_4_ = _S_red;
      local_230 = (_Base_ptr)0x0;
      local_260 = (pointer)0x0;
      auStack_258._0_8_ = (__node_base_ptr)0x0;
      puStack_270 = (pointer)0x0;
      local_268 = (pointer)0x0;
      local_280 = (BasicBlock *)0x0;
      _Stack_278._M_nxt = (_Hash_node_base *)0x0;
      local_290 = (Module *)0x0;
      pBStack_288 = (BasicBlock *)0x0;
      local_2a0 = (pointer)0x0;
      pFStack_298 = (Function *)0x0;
      local_2b0 = (pointer)0x0;
      pTStack_2a8 = (pointer)0x0;
      auStack_258._8_8_ = (OptInfo *)0x0;
      local_228 = (_Base_ptr)(auStack_258 + 0x20);
      local_158._M_color = _S_red;
      local_158._M_parent = (_Base_ptr)0x0;
      local_220 = local_228;
      memset(local_218,0,0xb2);
      local_158._M_left = &local_158;
      local_138 = 0;
      auStack_3b8 = (undefined1  [8])&PTR__WalkerPass_01123168;
      local_130 = local_120;
      local_158._M_right = local_158._M_left;
      Pass::setPassRunner((Pass *)auStack_3b8,
                          (PassRunner *)
                          optInfo.newOnceGlobalsSetInFuncs._M_h._M_single_bucket[1]._M_nxt);
      (**(code **)((long)auStack_3b8 + 0x10))
                ((WalkerPass<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>_>
                  *)auStack_3b8,module);
      WalkerPass<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>_>
      ::~WalkerPass((WalkerPass<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>_>
                     *)auStack_3b8);
      std::
      _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::operator=((_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)&optInfo.onceFuncs._M_h._M_single_bucket,
                  (_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)__ht);
      uVar6 = 0;
      psVar12 = &optInfo.onceGlobalsSetInFuncs._M_h._M_bucket_count;
      while (psVar12 = (size_type *)*psVar12, psVar12 != (size_type *)0x0) {
        uVar6 = uVar6 + *(int *)(psVar12 + 6);
      }
      if (uVar6 < uVar19) {
        __assert_fail("currOnceGlobalsSet >= lastOnceGlobalsSet",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/OnceReduction.cpp"
                      ,0x1b4,"virtual void wasm::OnceReduction::run(Module *)");
      }
      bVar18 = uVar19 < uVar6;
      uVar19 = uVar6;
    } while (bVar18);
    auStack_3b8 = (undefined1  [8])&_Stack_388;
    global_1.super_IString.str._M_len = 1;
    global_1.super_IString.str._M_str = (char *)0x0;
    local_398._M_allocated_capacity._0_4_ = 0x3f800000;
    local_398._8_8_ = 0;
    _Stack_388._M_value._M_dataplus._M_p = (_Alloc_hider)(pointer)0x0;
    puVar2 = (module->functions).
             super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar14 = (module->functions).
                   super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar14 != puVar2;
        puVar14 = puVar14 + 1) {
      pmVar8 = std::__detail::
               _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::at((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     *)&optInfo.onceGlobals._M_h._M_single_bucket,
                    (key_type *)
                    (puVar14->_M_t).
                    super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t
                    .super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                    super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl);
      if ((pmVar8->super_IString).str._M_str != (char *)0x0) {
        pEVar16 = ((puVar14->_M_t).
                   super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                   super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                   super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl)->body;
        pBVar9 = Expression::cast<wasm::Block>(pEVar16);
        sVar5 = (pBVar9->list).
                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
                usedElements;
        if (sVar5 == 3) {
          this_01 = &pBVar9->list;
          ppEVar10 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::
                     operator[](&this_01->
                                 super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                                ,2);
          if ((*ppEVar10)->_id == CallId) {
            pEVar16 = *ppEVar10 + 3;
            pmVar8 = std::__detail::
                     _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     ::at((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&optInfo.onceGlobals._M_h._M_single_bucket,(key_type *)pEVar16);
            if ((pmVar8->super_IString).str._M_str != (char *)0x0) {
              sVar11 = std::
                       _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                       ::count((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                                *)auStack_3b8,(key_type *)pEVar16);
              if (sVar11 == 0) {
                ppEVar10 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::
                           operator[](&this_01->
                                       super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                                      ,0);
                pEVar16 = *ppEVar10;
                pEVar16->_id = NopId;
                (pEVar16->type).id = 0;
                ppEVar10 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::
                           operator[](&this_01->
                                       super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                                      ,1);
                pEVar16 = *ppEVar10;
                pEVar16->_id = NopId;
                (pEVar16->type).id = 0;
                std::__detail::
                _Insert_base<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                ::insert((_Insert_base<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                          *)auStack_3b8,
                         (value_type *)
                         (puVar14->_M_t).
                         super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                         .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl);
              }
            }
          }
        }
        else if (sVar5 == 2) {
          pEVar16->_id = NopId;
          (pEVar16->type).id = 0;
        }
      }
    }
    std::
    _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)auStack_3b8);
  }
  anon_unknown_22::OptInfo::~OptInfo((OptInfo *)local_120);
  return;
}

Assistant:

void run(Module* module) override {
    OptInfo optInfo;

    // Fill out the initial data.
    for (auto& global : module->globals) {
      // For a global to possibly be "once", it must be an integer, and to not
      // be imported (as a mutable import may be read and written to from the
      // outside). As we scan code we will turn this into false if we see
      // anything that proves the global is not "once".
      // TODO: This limitation could perhaps only be on mutable ones, but
      //       immutable globals will not be considered "once" anyhow as they do
      //       not fit the pattern of being written after the first call.
      // TODO: non-integer types?
      optInfo.onceGlobals[global->name] =
        global->type.isInteger() && !global->imported();
    }
    for (auto& func : module->functions) {
      // Fill in the map so that it can be operated on in parallel.
      optInfo.onceFuncs[func->name] = Name();
    }
    for (auto& ex : module->exports) {
      if (ex->kind == ExternalKind::Global) {
        // An exported global cannot be "once" since the outside may read and
        // write to it in ways we are unaware.
        // TODO: See comment above on mutability.
        optInfo.onceGlobals[*ex->getInternalName()] = false;
      }
    }

    // Scan the module to find out which globals and functions are "once".
    Scanner(optInfo).run(getPassRunner(), module);

    // Combine the information. We found which globals appear to be "once", but
    // other information may have proven they are not so, in fact. Specifically,
    // for a function to be "once" we need its global to also be such.
    for (auto& [_, onceGlobal] : optInfo.onceFuncs) {
      if (onceGlobal.is() && !optInfo.onceGlobals[onceGlobal]) {
        onceGlobal = Name();
      }
    }

    // Optimize using what we found. Keep iterating while we find things to
    // optimize, which we estimate using a counter of the total number of once
    // globals set by functions: as that increases, it means we are propagating
    // useful information.
    // TODO: limit # of iterations?
    Index lastOnceGlobalsSet = 0;

    // First, initialize onceGlobalsSetInFuncs for the first iteration, by
    // ensuring each item is present, and adding the "once" global for "once"
    // funcs.
    bool foundOnce = false;
    for (auto& func : module->functions) {
      // Either way, at least fill the data structure for parallel operation.
      auto& set = optInfo.onceGlobalsSetInFuncs[func->name];

      auto global = optInfo.onceFuncs[func->name];
      if (global.is()) {
        set.insert(global);
        foundOnce = true;
      }
    }

    if (!foundOnce) {
      // Nothing to optimize.
      return;
    }

    while (1) {
      // Initialize all the items in the new data structure that will be
      // populated.
      for (auto& func : module->functions) {
        optInfo.newOnceGlobalsSetInFuncs[func->name];
      }

      Optimizer(optInfo).run(getPassRunner(), module);

      optInfo.onceGlobalsSetInFuncs =
        std::move(optInfo.newOnceGlobalsSetInFuncs);

      // Count how many once globals are set, and see if we have any more work
      // to do.
      Index currOnceGlobalsSet = 0;
      for (auto& [_, globals] : optInfo.onceGlobalsSetInFuncs) {
        currOnceGlobalsSet += globals.size();
      }
      assert(currOnceGlobalsSet >= lastOnceGlobalsSet);
      if (currOnceGlobalsSet > lastOnceGlobalsSet) {
        lastOnceGlobalsSet = currOnceGlobalsSet;
        continue;
      }
      break;
    }

    // Finally, apply some optimizations to "once" functions themselves. We do
    // this at the end to not modify them as we go, which could confuse the main
    // part of this pass right before us.
    optimizeOnceBodies(optInfo, module);
  }